

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextmarkdownimporter.cpp
# Opt level: O0

void __thiscall
QTextMarkdownImporter::QTextMarkdownImporter
          (QTextMarkdownImporter *this,QTextDocument *doc,Features features)

{
  long lVar1;
  ColorGroup in_EDX;
  QTextImageFormat *in_RSI;
  QPalette *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QTextCursor::QTextCursor
            ((QTextCursor *)CONCAT44(in_EDX,in_stack_fffffffffffffff0),(QTextDocument *)in_RDI);
  *(undefined8 *)&in_RDI->currentGroup = 0;
  QString::QString((QString *)0x9fc5ec);
  QString::QString((QString *)0x9fc5f9);
  QList<int>::QList((QList<int> *)0x9fc606);
  QStack<QPointer<QTextList>_>::QStack((QStack<QPointer<QTextList>_> *)0x9fc613);
  QStack<QTextCharFormat>::QStack((QStack<QTextCharFormat> *)0x9fc620);
  QFontDatabase::systemFont(doc._4_4_);
  QPalette::QPalette(in_RDI);
  in_RDI[10].currentGroup = Active;
  *(undefined4 *)&in_RDI[10].field_0xc = 0;
  *(undefined4 *)&in_RDI[0xb].d = 0;
  *(undefined4 *)((long)&in_RDI[0xb].d + 4) = 0;
  in_RDI[0xb].currentGroup = ~Active;
  *(undefined4 *)&in_RDI[0xb].field_0xc = 0;
  *(undefined4 *)&in_RDI[0xc].d = 0;
  *(undefined1 *)((long)&in_RDI[0xc].d + 4) = 0;
  in_RDI[0xc].currentGroup = in_EDX;
  QTextImageFormat::QTextImageFormat(in_RSI);
  QTextListFormat::QTextListFormat((QTextListFormat *)in_RSI);
  *(undefined4 *)&in_RDI[0xf].d = 0;
  *(undefined1 *)((long)&in_RDI[0xf].d + 4) = 0;
  *(undefined1 *)((long)&in_RDI[0xf].d + 5) = 0;
  *(undefined1 *)((long)&in_RDI[0xf].d + 6) = 0;
  *(undefined1 *)((long)&in_RDI[0xf].d + 7) = 0;
  *(undefined1 *)&in_RDI[0xf].currentGroup = Active;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTextMarkdownImporter::QTextMarkdownImporter(QTextDocument *doc, QTextMarkdownImporter::Features features)
  : m_cursor(doc)
  , m_monoFont(QFontDatabase::systemFont(QFontDatabase::FixedFont))
  , m_features(features)
{
}